

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void makeniche(level *lev,int trap_type)

{
  int iVar1;
  char cVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  trap *ptVar6;
  permonst *ptr;
  uint y;
  undefined4 in_register_00000034;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  mkroom *aroom;
  coord local_42;
  ulong local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000034,trap_type);
  if (lev->doorindex < 0x78) {
    for (iVar8 = -8; iVar8 != 0; iVar8 = iVar8 + 1) {
      uVar4 = rn2(lev->nroom);
      if ((lev->rooms[uVar4].rtype == '\0') &&
         ((aroom = lev->rooms + uVar4, aroom->doorct != '\x01' ||
          (uVar4 = mt_random(), uVar4 % 5 == 0)))) {
        uVar4 = mt_random();
        if ((uVar4 & 1) == 0) {
          cVar2 = aroom->ly + -1;
          finddpos(lev,&local_42,aroom->lx,cVar2,aroom->hx,cVar2);
          iVar1 = -1;
        }
        else {
          cVar2 = aroom->hy + '\x01';
          finddpos(lev,&local_42,aroom->lx,cVar2,aroom->hx,cVar2);
          iVar1 = 1;
        }
        uVar9 = local_38;
        uVar4 = (uint)local_42.x;
        if (uVar4 - 1 < 0x4f) {
          uVar7 = (uint)local_42.y;
          local_40 = (ulong)uVar7;
          y = iVar1 + uVar7;
          if (y < 0x15) {
            if ((((lev->locations[uVar4][y].typ == '\0') && (uVar7 = uVar7 - iVar1, uVar7 < 0x15))
                && (cVar2 = lev->locations[uVar4][uVar7].typ, 3 < (byte)(cVar2 - 0x11U))) &&
               (7 < (byte)(cVar2 - 0x1aU))) {
              if ((int)local_38 == 0) {
                uVar7 = mt_random();
                if ((uVar7 & 3) != 0) {
                  lev->locations[(int)uVar4][y].typ = '\x18';
                  uVar7 = mt_random();
                  uVar5 = mt_random();
                  if (uVar7 % 7 == 0) {
                    if ((uVar5 & 7) == 0) {
                      cVar2 = lev->locations[(int)uVar4][(int)local_40].typ;
                      if (cVar2 < '\r' && cVar2 != '\0') {
                        lev->locations[(int)uVar4][(int)local_40].typ = '\x16';
                        uVar7 = mt_random();
                        if (uVar7 % 3 != 0) {
                          ptr = mkclass(&lev->z,'5',0);
                          mkcorpstat(0x10e,(monst *)0x0,ptr,lev,uVar4,y,'\x01');
                        }
                      }
                    }
                    if (((lev->flags).field_0x9 & 8) == 0) {
                      mksobj_at(0x15c,lev,uVar4,y,'\x01','\0');
                    }
                    uVar7 = mt_random();
                    if (uVar7 % 3 != 0) {
                      return;
                    }
                    mkobj_at('\0',lev,uVar4,y,'\x01');
                    return;
                  }
                  iVar8 = (uint)(uVar5 % 5 == 0) * 8 + 0xf;
                  goto LAB_001d0fe3;
                }
                lev->locations[(int)uVar4][y].typ = '\x10';
              }
              else {
                lev->locations[(int)uVar4][y].typ = '\x10';
                if ((int)local_38 - 0xdU < 2) {
                  bVar3 = can_fall_thru(lev);
                  uVar9 = uVar9 & 0xffffffff;
                  if (bVar3 == '\0') {
                    uVar9 = 3;
                  }
                }
                ptVar6 = maketrap(lev,uVar4,y,(int)uVar9);
                if (ptVar6 != (trap *)0x0) {
                  if ((int)uVar9 != 3) {
                    ptVar6->field_0x8 = ptVar6->field_0x8 | 0x40;
                  }
                  if ((0x1fcbfffUL >> (uVar9 & 0x3f) & 1) == 0) {
                    make_engr_at(lev,uVar4,uVar7,trap_engravings[uVar9 & 0xffffffff],0,'\x01');
                    wipe_engr_at(lev,local_42.x,(xchar)uVar7,'\x05');
                  }
                }
              }
              iVar8 = 0xf;
LAB_001d0fe3:
              dosdoor(lev,local_42.x,(xchar)local_40,aroom,iVar8);
              return;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void makeniche(struct level *lev, int trap_type)
{
	struct mkroom *aroom;
	struct rm *rm;
	int vct = 8;
	int dy, xx, yy;
	struct trap *ttmp;

	if (lev->doorindex < DOORMAX)
	  while (vct--) {
	    aroom = &lev->rooms[rn2(lev->nroom)];
	    if (aroom->rtype != OROOM) continue;	/* not an ordinary room */
	    if (aroom->doorct == 1 && rn2(5)) continue;
	    if (!place_niche(lev, aroom, &dy, &xx, &yy)) continue;

	    rm = &lev->locations[xx][yy+dy];
	    if (trap_type || !rn2(4)) {

		rm->typ = SCORR;
		if (trap_type) {
		    if ((trap_type == HOLE || trap_type == TRAPDOOR)
			&& !can_fall_thru(lev))
			trap_type = ROCKTRAP;
		    ttmp = maketrap(lev, xx, yy+dy, trap_type);
		    if (ttmp) {
			if (trap_type != ROCKTRAP) ttmp->once = 1;
			if (trap_engravings[trap_type]) {
			    make_engr_at(lev, xx, yy-dy,
				     trap_engravings[trap_type], 0L, DUST);
			    wipe_engr_at(lev, xx, yy-dy, 5); /* age it a little */
			}
		    }
		}
		dosdoor(lev, xx, yy, aroom, SDOOR);
	    } else {
		rm->typ = CORR;
		if (rn2(7)) {
		    dosdoor(lev, xx, yy, aroom, rn2(5) ? SDOOR : DOOR);
		} else {
		    /* inaccessible niches occasionally have iron bars */
		    if (!rn2(8) && IS_WALL(lev->locations[xx][yy].typ)) {
			lev->locations[xx][yy].typ = IRONBARS;
			if (rn2(3)) {
			    mkcorpstat(CORPSE, NULL, mkclass(&lev->z, S_HUMAN, 0),
				       lev, xx, yy + dy, TRUE);
			}
		    }
		    if (!lev->flags.noteleport)
			mksobj_at(SCR_TELEPORTATION, lev,
					 xx, yy+dy, TRUE, FALSE);
		    if (!rn2(3)) mkobj_at(0, lev, xx, yy+dy, TRUE);
		}
	    }
	    return;
	}
}